

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall ki::protocol::dml::Message::read_from(Message *this,istream *istream)

{
  istream *piVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  value_error *pvVar4;
  char *pcVar5;
  ulong uVar6;
  parse_error *this_00;
  allocator local_99;
  string local_98 [36];
  uint16_t local_74;
  undefined1 local_72;
  allocator local_71;
  string local_70 [4];
  uint16_t size;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  istream *local_18;
  istream *istream_local;
  Message *this_local;
  
  local_18 = istream;
  istream_local = (istream *)this;
  MessageHeader::read_from(&this->m_header,istream);
  if (this->m_template == (MessageTemplate *)0x0) {
    local_74 = MessageHeader::get_message_size(&this->m_header);
    std::vector<char,_std::allocator<char>_>::resize(&this->m_raw_data,(ulong)local_74);
    piVar1 = local_18;
    pcVar5 = std::vector<char,_std::allocator<char>_>::data(&this->m_raw_data);
    std::istream::read((char *)piVar1,(long)pcVar5);
    uVar6 = std::ios::fail();
    if ((uVar6 & 1) != 0) {
      this_00 = (parse_error *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_98,"Not enough data was available to read DML message payload.",&local_99);
      parse_error::parse_error(this_00,(string *)local_98,INSUFFICIENT_MESSAGE_DATA);
      __cxa_throw(this_00,&parse_error::typeinfo,parse_error::~parse_error);
    }
  }
  else {
    uVar2 = MessageHeader::get_service_id(&this->m_header);
    uVar3 = MessageTemplate::get_service_id(this->m_template);
    if (uVar2 != uVar3) {
      local_4d = 1;
      pvVar4 = (value_error *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_38,"ServiceID mismatch between MessageHeader and assigned template.",
                 &local_39);
      value_error::value_error(pvVar4,(string *)local_38,DML_INVALID_SERVICE);
      local_4d = 0;
      __cxa_throw(pvVar4,&value_error::typeinfo,value_error::~value_error);
    }
    uVar2 = MessageHeader::get_type(&this->m_header);
    uVar3 = MessageTemplate::get_type(this->m_template);
    if (uVar2 != uVar3) {
      local_72 = 1;
      pvVar4 = (value_error *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_70,"Message Type mismatch between MessageHeader and assigned template.",
                 &local_71);
      value_error::value_error(pvVar4,(string *)local_70,DML_INVALID_MESSAGE_TYPE);
      local_72 = 0;
      __cxa_throw(pvVar4,&value_error::typeinfo,value_error::~value_error);
    }
    ki::dml::Record::read_from(this->m_record,local_18);
  }
  return;
}

Assistant:

void Message::read_from(std::istream &istream)
	{
		m_header.read_from(istream);
		if (m_template)
		{
			// Check for mismatches between the header and template
			if (m_header.get_service_id() != m_template->get_service_id())
				throw value_error("ServiceID mismatch between MessageHeader and assigned template.",
					value_error::DML_INVALID_SERVICE);
			if (m_header.get_type() != m_template->get_type())
				throw value_error("Message Type mismatch between MessageHeader and assigned template.",
					value_error::DML_INVALID_MESSAGE_TYPE);
			
			// Read the payload into the record
			m_record->read_from(istream);
		}
		else
		{
			// We don't have a template for the record structure, so
			// just read the raw data into a buffer.
			const auto size = m_header.get_message_size();
			m_raw_data.resize(size);
			istream.read(m_raw_data.data(), size);
			if (istream.fail())
				throw parse_error("Not enough data was available to read DML message payload.",
					parse_error::INSUFFICIENT_MESSAGE_DATA);
		}
	}